

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::ReplaceComponentOfInterfaceVarWith
          (InterfaceVariableScalarReplacement *this,Instruction *interface_var,
          Instruction *interface_var_user,Instruction *scalar_var,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *interface_var_component_indices,
          uint32_t *extra_array_index,
          unordered_map<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>_>
          *loads_to_component_values,
          unordered_map<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>_>
          *loads_for_access_chain_to_component_values)

{
  size_t *psVar1;
  Op OVar2;
  pointer pOVar3;
  IRContext *pIVar4;
  _Rb_tree<unsigned_int,std::pair<unsigned_int_const,spvtools::opt::Instruction*>,std::_Select1st<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>>
  *this_00;
  bool bVar5;
  uint32_t uVar6;
  Instruction *this_01;
  ulong uVar7;
  long *plVar8;
  size_t *psVar9;
  uint uVar10;
  ulong uVar11;
  __hashtable *__h;
  string message;
  spv_position_t local_98;
  long lStack_80;
  undefined1 local_78 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_58;
  string local_50;
  
  OVar2 = interface_var_user->opcode_;
  if (OVar2 == OpLoad) {
    local_78._8_8_ = LoadScalarVar(this,scalar_var,extra_array_index,interface_var_user);
    local_78._0_8_ = interface_var_user;
    std::
    _Hashtable<spvtools::opt::Instruction*,std::pair<spvtools::opt::Instruction*const,spvtools::opt::Instruction*>,std::allocator<std::pair<spvtools::opt::Instruction*const,spvtools::opt::Instruction*>>,std::__detail::_Select1st,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<std::pair<spvtools::opt::Instruction*const,spvtools::opt::Instruction*>>
              ((_Hashtable<spvtools::opt::Instruction*,std::pair<spvtools::opt::Instruction*const,spvtools::opt::Instruction*>,std::allocator<std::pair<spvtools::opt::Instruction*const,spvtools::opt::Instruction*>>,std::__detail::_Select1st,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)loads_to_component_values);
  }
  else if (OVar2 == OpStore) {
    uVar10 = (interface_var_user->has_result_id_ & 1) + 1;
    if (interface_var_user->has_type_id_ == false) {
      uVar10 = (uint)interface_var_user->has_result_id_;
    }
    uVar6 = Instruction::GetSingleWordOperand(interface_var_user,uVar10 + 1);
    StoreComponentOfValueToScalarVar
              (this,uVar6,interface_var_component_indices,scalar_var,extra_array_index,
               interface_var_user);
  }
  else {
    if ((extra_array_index != (uint32_t *)0x0) && (*extra_array_index != 0)) {
      return true;
    }
    if ((int)OVar2 < 0x47) {
      if (OVar2 == OpName) {
        this_01 = Instruction::Clone(interface_var_user,(this->super_Pass).context_);
        local_78[0x10] = '\0';
        local_78[0x11] = '\0';
        local_78[0x12] = '\0';
        local_78[0x13] = '\0';
        if (scalar_var->has_result_id_ == true) {
          local_78._16_4_ =
               Instruction::GetSingleWordOperand(scalar_var,(uint)scalar_var->has_type_id_);
        }
        local_78._24_8_ = local_78 + 0x10;
        local_78._0_8_ = &PTR__SmallVector_003e9b28;
        local_58._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
        local_78._8_8_ = (Instruction *)0x1;
        uVar7 = (ulong)(this_01->has_result_id_ & 1) + 1;
        if (this_01->has_type_id_ == false) {
          uVar7 = (ulong)this_01->has_result_id_;
        }
        pOVar3 = (this_01->operands_).
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar11 = ((long)(this_01->operands_).
                        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar3 >> 4) *
                 -0x5555555555555555;
        if (uVar11 < uVar7 || uVar11 - uVar7 == 0) {
          __assert_fail("index < operands_.size() && \"operand index out of bound\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h"
                        ,0x2b8,
                        "void spvtools::opt::Instruction::SetOperand(uint32_t, Operand::OperandData &&)"
                       );
        }
        utils::SmallVector<unsigned_int,_2UL>::operator=
                  ((SmallVector<unsigned_int,_2UL> *)
                   ((long)((pOVar3->words).buffer + 0xfffffffffffffffc) +
                   (ulong)(uint)((int)uVar7 * 0x30)),(SmallVector<unsigned_int,_2UL> *)local_78);
        local_78._0_8_ = &PTR__SmallVector_003e9b28;
        if (local_58._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
          std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                    ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                     &local_58,local_58._M_head_impl);
        }
        pIVar4 = (this->super_Pass).context_;
        if (((pIVar4->valid_analyses_ & kAnalysisNameMap) != kAnalysisNone) &&
           (this_01->opcode_ - OpName < 2)) {
          this_00 = (_Rb_tree<unsigned_int,std::pair<unsigned_int_const,spvtools::opt::Instruction*>,std::_Select1st<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>>
                     *)(pIVar4->id_to_name_)._M_t.
                       super___uniq_ptr_impl<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>,_std::default_delete<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_*,_std::default_delete<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_>_>
                       .
                       super__Head_base<0UL,_std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_*,_false>
                       ._M_head_impl;
          uVar6 = (this_01->has_result_id_ & 1) + 1;
          if (this_01->has_type_id_ == false) {
            uVar6 = (uint)this_01->has_result_id_;
          }
          uVar6 = Instruction::GetSingleWordOperand(this_01,uVar6);
          local_78._0_4_ = uVar6;
          local_78._8_8_ = this_01;
          std::
          _Rb_tree<unsigned_int,std::pair<unsigned_int_const,spvtools::opt::Instruction*>,std::_Select1st<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>>
          ::_M_insert_equal<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>
                    (this_00,(pair<const_unsigned_int,_spvtools::opt::Instruction_*> *)local_78);
        }
        if ((pIVar4->valid_analyses_ & kAnalysisBegin) != kAnalysisNone) {
          analysis::DefUseManager::AnalyzeInstDefUse
                    ((pIVar4->def_use_mgr_)._M_t.
                     super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                     .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                     _M_head_impl,this_01);
        }
        utils::IntrusiveList<spvtools::opt::Instruction>::push_back
                  (&(((pIVar4->module_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                      .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->debugs2_
                    ).super_IntrusiveList<spvtools::opt::Instruction>,this_01);
      }
      else {
        if (OVar2 == OpEntryPoint) {
          uVar6 = 0;
          if (scalar_var->has_result_id_ == true) {
            uVar6 = Instruction::GetSingleWordOperand(scalar_var,(uint)scalar_var->has_type_id_);
          }
          bVar5 = ReplaceInterfaceVarInEntryPoint(this,interface_var,interface_var_user,uVar6);
          return bVar5;
        }
        if (OVar2 != OpAccessChain) goto LAB_00231791;
        ReplaceAccessChainWith
                  (this,interface_var_user,interface_var_component_indices,scalar_var,
                   loads_for_access_chain_to_component_values);
      }
    }
    else {
      if (((OVar2 != OpDecorate) && (OVar2 != OpDecorateString)) && (OVar2 != OpDecorateId)) {
LAB_00231791:
        local_78._0_8_ = local_78 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_78,"Unhandled instruction","");
        Instruction::PrettyPrint_abi_cxx11_(&local_50,interface_var_user,0x40);
        plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x345675);
        psVar1 = &local_98.index;
        psVar9 = (size_t *)(plVar8 + 2);
        if ((size_t *)*plVar8 == psVar9) {
          local_98.index = *psVar9;
          lStack_80 = plVar8[3];
          local_98.line = (size_t)psVar1;
        }
        else {
          local_98.index = *psVar9;
          local_98.line = (size_t)*plVar8;
        }
        local_98.column = plVar8[1];
        *plVar8 = (long)psVar9;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        std::__cxx11::string::_M_append(local_78,local_98.line);
        if ((size_t *)local_98.line != psVar1) {
          operator_delete((void *)local_98.line,local_98.index + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        Instruction::PrettyPrint_abi_cxx11_(&local_50,interface_var,0x40);
        plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x34564b);
        psVar9 = (size_t *)(plVar8 + 2);
        if ((size_t *)*plVar8 == psVar9) {
          local_98.index = *psVar9;
          lStack_80 = plVar8[3];
          local_98.line = (size_t)psVar1;
        }
        else {
          local_98.index = *psVar9;
          local_98.line = (size_t)*plVar8;
        }
        local_98.column = plVar8[1];
        *plVar8 = (long)psVar9;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        std::__cxx11::string::_M_append(local_78,local_98.line);
        if ((size_t *)local_98.line != psVar1) {
          operator_delete((void *)local_98.line,local_98.index + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        local_98.line = 0;
        local_98.column = 0;
        local_98.index = 0;
        std::
        function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
        operator()(&((this->super_Pass).context_)->consumer_,SPV_MSG_ERROR,"",&local_98,
                   (char *)local_78._0_8_);
        if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
          operator_delete((void *)local_78._0_8_,CONCAT44(local_78._20_4_,local_78._16_4_) + 1);
        }
        return false;
      }
      uVar6 = 0;
      if (scalar_var->has_result_id_ == true) {
        uVar6 = Instruction::GetSingleWordOperand(scalar_var,(uint)scalar_var->has_type_id_);
      }
      CloneAnnotationForVariable(this,interface_var_user,uVar6);
    }
  }
  return true;
}

Assistant:

bool InterfaceVariableScalarReplacement::ReplaceComponentOfInterfaceVarWith(
    Instruction* interface_var, Instruction* interface_var_user,
    Instruction* scalar_var,
    const std::vector<uint32_t>& interface_var_component_indices,
    const uint32_t* extra_array_index,
    std::unordered_map<Instruction*, Instruction*>* loads_to_component_values,
    std::unordered_map<Instruction*, Instruction*>*
        loads_for_access_chain_to_component_values) {
  spv::Op opcode = interface_var_user->opcode();
  if (opcode == spv::Op::OpStore) {
    uint32_t value_id = interface_var_user->GetSingleWordInOperand(1);
    StoreComponentOfValueToScalarVar(value_id, interface_var_component_indices,
                                     scalar_var, extra_array_index,
                                     interface_var_user);
    return true;
  }
  if (opcode == spv::Op::OpLoad) {
    Instruction* scalar_load =
        LoadScalarVar(scalar_var, extra_array_index, interface_var_user);
    loads_to_component_values->insert({interface_var_user, scalar_load});
    return true;
  }

  // Copy OpName and annotation instructions only once. Therefore, we create
  // them only for the first element of the extra array.
  if (extra_array_index && *extra_array_index != 0) return true;

  if (opcode == spv::Op::OpDecorateId || opcode == spv::Op::OpDecorateString ||
      opcode == spv::Op::OpDecorate) {
    CloneAnnotationForVariable(interface_var_user, scalar_var->result_id());
    return true;
  }

  if (opcode == spv::Op::OpName) {
    std::unique_ptr<Instruction> new_inst(interface_var_user->Clone(context()));
    new_inst->SetInOperand(0, {scalar_var->result_id()});
    context()->AddDebug2Inst(std::move(new_inst));
    return true;
  }

  if (opcode == spv::Op::OpEntryPoint) {
    return ReplaceInterfaceVarInEntryPoint(interface_var, interface_var_user,
                                           scalar_var->result_id());
  }

  if (opcode == spv::Op::OpAccessChain) {
    ReplaceAccessChainWith(interface_var_user, interface_var_component_indices,
                           scalar_var,
                           loads_for_access_chain_to_component_values);
    return true;
  }

  std::string message("Unhandled instruction");
  message += "\n  " + interface_var_user->PrettyPrint(
                          SPV_BINARY_TO_TEXT_OPTION_FRIENDLY_NAMES);
  message +=
      "\nfor interface variable scalar replacement\n  " +
      interface_var->PrettyPrint(SPV_BINARY_TO_TEXT_OPTION_FRIENDLY_NAMES);
  context()->consumer()(SPV_MSG_ERROR, "", {0, 0, 0}, message.c_str());
  return false;
}